

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

__m128i murk(__m128i a,__m128i b,__m128i c,__m128i d,__m128i e)

{
  __m128i x;
  __m128i x_00;
  longlong in_RCX;
  longlong in_RDX;
  longlong in_RSI;
  longlong in_RDI;
  longlong in_XMM3_Qa;
  __m128i alVar1;
  __m128i alVar2;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i y;
  __m128i y_00;
  __m128i y_01;
  __m128i y_02;
  
  x_01[1] = in_RSI;
  x_01[0] = in_RDI;
  y[1] = in_RCX;
  y[0] = in_RDX;
  mul32x4(x_01,y);
  alVar1[1] = in_XMM3_Qa;
  alVar1[0] = 0x21453f;
  alVar1 = rol32x4_17(alVar1);
  y_00[0] = alVar1[1];
  x_02[1] = in_RSI;
  x_02[0] = in_RDI;
  y_00[1] = in_RCX;
  alVar1 = mul32x4(x_02,y_00);
  y_01[0] = alVar1[1];
  x_03[1] = in_RSI;
  x_03[0] = in_RDI;
  y_01[1] = in_RCX;
  xor128(x_03,y_01);
  x[1] = in_XMM3_Qa;
  x[0] = 0x21455d;
  rol32x4_19(x);
  x_00[1] = in_XMM3_Qa;
  x_00[0] = 0x214562;
  alVar1 = mul32x4_5(x_00);
  y_02[0] = alVar1[1];
  x_04[1] = in_RSI;
  x_04[0] = in_RDI;
  y_02[1] = in_RCX;
  alVar1 = add32x4(x_04,y_02);
  alVar2[0] = alVar1[0];
  alVar2[1] = alVar1[1];
  return alVar2;
}

Assistant:

static inline __m128i murk(__m128i a, __m128i b, __m128i c, __m128i d, __m128i e) {

  return add32x4(e,
             mul32x4_5(
                 rol32x4_19(
                     xor128(
                         mul32x4(d,
                             rol32x4_17(
                                 mul32x4(c, a))),
                         (b)))));
}